

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_match.c
# Opt level: O0

wchar_t match_list_unmatched_inclusions_next
                  (archive_match *a,match_list *list,wchar_t mbs,void **vp)

{
  wchar_t wVar1;
  int *piVar2;
  undefined8 *in_RCX;
  int in_EDX;
  undefined8 *in_RSI;
  wchar_t *p_1;
  char *p;
  wchar_t r;
  match *m;
  wchar_t **in_stack_ffffffffffffffb8;
  archive_mstring *in_stack_ffffffffffffffc0;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  undefined8 *local_30;
  
  *in_RCX = 0;
  if (*(int *)(in_RSI + 4) == 0) {
    if (in_RSI[3] == 0) {
      if (*(int *)((long)in_RSI + 0x14) == 0) {
        return L'\x01';
      }
      in_RSI[3] = *in_RSI;
    }
    for (local_30 = (undefined8 *)in_RSI[3]; local_30 != (undefined8 *)0x0;
        local_30 = (undefined8 *)*local_30) {
      if (*(int *)(local_30 + 1) == 0) {
        if (in_EDX == 0) {
          wVar1 = archive_mstring_get_wcs
                            ((archive *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
          if ((wVar1 < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
            wVar1 = error_nomem((archive_match *)0x230b25);
            return wVar1;
          }
          if (in_stack_ffffffffffffffb8 == (wchar_t **)0x0) {
            in_stack_ffffffffffffffb8 = (wchar_t **)(anon_var_dwarf_6eae6 + 6);
          }
          *in_RCX = in_stack_ffffffffffffffb8;
        }
        else {
          wVar1 = archive_mstring_get_mbs
                            ((archive *)
                             CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8),
                             in_stack_ffffffffffffffc0,(char **)in_stack_ffffffffffffffb8);
          if ((wVar1 < L'\0') && (piVar2 = __errno_location(), *piVar2 == 0xc)) {
            wVar1 = error_nomem((archive_match *)0x230ac4);
            return wVar1;
          }
          if (in_stack_ffffffffffffffc0 == (archive_mstring *)0x0) {
            in_stack_ffffffffffffffc0 = (archive_mstring *)0x2eb45b;
          }
          *in_RCX = in_stack_ffffffffffffffc0;
        }
        in_RSI[3] = *local_30;
        if (in_RSI[3] == 0) {
          *(undefined4 *)(in_RSI + 4) = 1;
        }
        return L'\0';
      }
    }
    in_RSI[3] = 0;
  }
  else {
    *(undefined4 *)(in_RSI + 4) = 0;
  }
  return L'\x01';
}

Assistant:

static int
match_list_unmatched_inclusions_next(struct archive_match *a,
    struct match_list *list, int mbs, const void **vp)
{
	struct match *m;

	*vp = NULL;
	if (list->unmatched_eof) {
		list->unmatched_eof = 0;
		return (ARCHIVE_EOF);
	}
	if (list->unmatched_next == NULL) {
		if (list->unmatched_count == 0)
			return (ARCHIVE_EOF);
		list->unmatched_next = list->first;
	}

	for (m = list->unmatched_next; m != NULL; m = m->next) {
		int r;

		if (m->matches)
			continue;
		if (mbs) {
			const char *p;
			r = archive_mstring_get_mbs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = "";
			*vp = p;
		} else {
			const wchar_t *p;
			r = archive_mstring_get_wcs(&(a->archive),
				&(m->pattern), &p);
			if (r < 0 && errno == ENOMEM)
				return (error_nomem(a));
			if (p == NULL)
				p = L"";
			*vp = p;
		}
		list->unmatched_next = m->next;
		if (list->unmatched_next == NULL)
			/* To return EOF next time. */
			list->unmatched_eof = 1;
		return (ARCHIVE_OK);
	}
	list->unmatched_next = NULL;
	return (ARCHIVE_EOF);
}